

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtering.cpp
# Opt level: O3

void Image_Function::Median
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,uint32_t kernelSize)

{
  uint uVar1;
  Image *out_00;
  pointer puVar2;
  imageException *this;
  pointer puVar3;
  uint32_t uVar4;
  undefined4 in_register_00000014;
  EVP_PKEY_CTX *src;
  uchar *puVar5;
  uint uVar6;
  pointer puVar7;
  uint32_t startXOut_00;
  undefined4 in_register_00000084;
  ulong uVar8;
  uint32_t startYOut_00;
  uint32_t height_00;
  Image *pIVar9;
  uchar *puVar10;
  ulong uVar11;
  allocator_type local_c9;
  ulong local_c8;
  Image *local_c0;
  ulong local_b8;
  uint32_t local_ac;
  uchar *local_a8;
  Image *local_a0;
  Image *local_98;
  pointer local_90;
  ulong local_88;
  ulong local_80;
  Image *local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  ImageTemplate<unsigned_char> local_58;
  
  local_c8 = CONCAT44(in_register_00000084,startXOut);
  local_b8 = CONCAT44(in_register_00000014,startYIn);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  local_58._data = (uchar *)0x0;
  local_58._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)out,src);
  local_c0 = in;
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(&local_58);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  if ((((kernelSize < height) && (kernelSize < width)) && (2 < kernelSize)) &&
     ((kernelSize & 1) != 0)) {
    uVar6 = kernelSize >> 1;
    uVar4 = (uint32_t)local_b8;
    local_98 = out;
    Copy(local_c0,startXIn,uVar4,out,(uint32_t)local_c8,startYOut,width,uVar6);
    out_00 = local_98;
    pIVar9 = local_c0;
    Copy(local_c0,startXIn,(height + uVar4) - uVar6,local_98,(uint32_t)local_c8,
         (height + startYOut) - uVar6,width,uVar6);
    startYOut_00 = startYOut + uVar6;
    uVar4 = uVar6 + (int)local_b8;
    local_90 = (pointer)CONCAT44(local_90._4_4_,uVar4);
    local_ac = kernelSize - 1;
    height_00 = height - local_ac;
    startXOut_00 = (uint32_t)local_c8;
    Copy(pIVar9,startXIn,uVar4,out_00,startXOut_00,startYOut_00,uVar6,height_00);
    local_a8 = (uchar *)(ulong)startXIn;
    Copy(local_c0,(width + startXIn) - uVar6,(uint32_t)local_90,out_00,
         (width + startXOut_00) - uVar6,startYOut_00,uVar6,height_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&data,(ulong)(kernelSize * kernelSize),&local_c9);
    puVar2 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar1 = out_00->_rowSize;
    if (height_00 * uVar1 != 0) {
      local_88 = (ulong)(width - local_ac);
      local_90 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      local_a0 = (Image *)(out_00->_data +
                          (ulong)uVar6 + (local_c8 & 0xffffffff) + (ulong)(startYOut_00 * uVar1));
      local_78 = (Image *)((long)&local_a0->_vptr_ImageTemplate + (ulong)(height_00 * uVar1));
      puVar7 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start +
               ((ulong)((long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 1);
      uVar6 = local_c0->_rowSize;
      uVar11 = (ulong)uVar6;
      local_a8 = local_c0->_data + ((ulong)local_a8 & 0xffffffff) + (ulong)((int)local_b8 * uVar6);
      local_b8 = (ulong)(uVar6 * kernelSize);
      local_98 = (Image *)((ulong)(uint)((int)LZCOUNT((long)data.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)data.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) * 2) ^
                          0x7e);
      local_c8 = CONCAT71(local_c8._1_7_,
                          puVar7 == data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish ||
                          data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start ==
                          data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish);
      local_80 = (ulong)uVar1;
      do {
        if (width != local_ac) {
          local_c0 = (Image *)((long)&local_a0->_vptr_ImageTemplate + local_88);
          pIVar9 = local_a0;
          puVar10 = local_a8;
          do {
            if (uVar11 != 0) {
              puVar3 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              puVar5 = puVar10;
              do {
                uVar8 = 0;
                do {
                  puVar3[uVar8] = puVar5[uVar8];
                  uVar8 = uVar8 + 1;
                } while (kernelSize != uVar8);
                puVar5 = puVar5 + uVar11;
                puVar3 = puVar3 + uVar8;
              } while (puVar5 != puVar10 + local_b8);
            }
            if ((char)local_c8 == '\0') {
              std::__introselect<unsigned_char*,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (puVar2,puVar7,local_90,local_98);
            }
            puVar10 = puVar10 + 1;
            *(uchar *)&pIVar9->_vptr_ImageTemplate = *puVar7;
            pIVar9 = (Image *)((long)&pIVar9->_vptr_ImageTemplate + 1);
          } while (pIVar9 != local_c0);
        }
        local_a8 = local_a8 + uVar11;
        local_a0 = (Image *)((long)&local_a0->_vptr_ImageTemplate + local_80);
      } while (local_a0 != local_78);
    }
    if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
    return;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this,"Kernel size for filter is not correct");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void Median( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                 uint32_t width, uint32_t height, uint32_t kernelSize )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( in, out );

        if( kernelSize < 3 || kernelSize % 2 == 0 || kernelSize >= width || kernelSize >= height )
            throw imageException( "Kernel size for filter is not correct" );

        // Border's problem is well-known problem which can be solved in different ways
        // We just copy parts of original image without applying filtering
        Copy( in, startXIn, startYIn, out, startXOut,
              startYOut, width, kernelSize / 2 );
        Copy( in, startXIn, startYIn + height - kernelSize / 2, out, startXOut,
              startYOut + height - kernelSize / 2, width, kernelSize / 2 );
        Copy( in, startXIn, startYIn + kernelSize / 2, out, startXOut,
              startYOut + kernelSize / 2, kernelSize / 2, height - (kernelSize - 1) );
        Copy( in, startXIn + width - kernelSize / 2, startYIn + kernelSize / 2, out, startXOut + width - kernelSize / 2,
              startYOut + kernelSize / 2, kernelSize / 2, height - (kernelSize - 1) );

        std::vector < uint8_t > data( kernelSize * kernelSize );
        uint8_t * dataFirstValue = data.data();
        uint8_t * medianValue    = dataFirstValue + data.size() / 2;
        uint8_t * dataLastValue  = dataFirstValue + data.size();
        
        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn                     * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + (startYOut + kernelSize / 2) * rowSizeOut + startXOut + kernelSize / 2;

        width  = width  - (kernelSize - 1);
        height = height - (kernelSize - 1);

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX, ++inX ) {
                uint8_t * value = data.data();

                const uint8_t * inYRead    = inX;
                const uint8_t * inYReadEnd = inYRead + kernelSize * rowSizeIn;

                for( ; inYRead != inYReadEnd; inYRead += rowSizeIn ) {
                    const uint8_t * inXRead    = inYRead;
                    const uint8_t * inXReadEnd = inXRead + kernelSize;

                    for( ; inXRead != inXReadEnd; ++inXRead, ++value )
                        *value = *inXRead;
                }

                std::nth_element( dataFirstValue, medianValue, dataLastValue );
                (*outX) = *medianValue;
            }
        }
    }